

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O3

void pnga_sprs_array_diag_right_multiply(Integer s_a,Integer g_d)

{
  float fVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  Integer IVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  int *_ptr;
  Integer iproc;
  void *buf;
  long lVar12;
  int *_buf;
  long lVar13;
  undefined1 (*pauVar14) [16];
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  bool bVar20;
  float fVar21;
  float fVar22;
  int64_t *jlptr;
  int64_t *ilptr;
  int *jptr;
  int *iptr;
  void *vptr;
  Integer khi;
  Integer klo;
  Integer one;
  Integer jhi;
  Integer jlo;
  Integer ihi;
  Integer ilo;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  Integer local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  int local_84;
  Integer local_80;
  Integer local_78;
  Integer local_70;
  long local_68;
  long local_60;
  Integer local_58;
  Integer local_50;
  ulong local_48;
  long local_40;
  long local_38;
  
  lVar18 = s_a + 1000;
  lVar12 = g_d + 1000;
  IVar8 = SPA[lVar18].grp;
  local_80 = g_d;
  iproc = pnga_pgroup_nodeid(IVar8);
  local_78 = pnga_pgroup_nnodes(IVar8);
  local_b0 = SPA[lVar18].type;
  local_48 = (ulong)(uint)SPA[lVar18].idx_size;
  local_b8 = 0;
  local_c0 = 0;
  local_c8 = 0;
  local_d0 = 0;
  local_70 = 1;
  bVar20 = _ga_sync_begin != 0;
  local_84 = _ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  local_a8 = lVar18 * 200;
  if (bVar20) {
    pnga_pgroup_sync(IVar8);
  }
  local_58 = IVar8;
  if (*(long *)((long)&SPA->idim + local_a8) != GA[lVar12].dims[0]) {
    pnga_error("(pnga_sprs_array_diag_right_multiply) dimensions don\'t match",0);
  }
  if (local_b0 != GA[lVar12].type) {
    pnga_error("(pnga_sprs_array_diag_right_multiply) data types don\'t match",0);
  }
  if (GA[lVar12].ndim != 1) {
    pnga_error("(pnga_sprs_array_diag_right_multiply) vector not of dimension 1",0);
  }
  pnga_sprs_array_row_distribution(s_a,iproc,&local_38,&local_40);
  if (0 < local_78) {
    lVar18 = 0;
    local_b0 = local_b0 + -0x3e9;
    local_50 = s_a;
    do {
      IVar8 = local_50;
      pnga_sprs_array_column_distribution(local_50,lVar18,&local_60,&local_68);
      if ((int)local_48 == 4) {
        pnga_sprs_array_access_col_block(IVar8,lVar18,&local_b8,&local_c0,&local_a0);
        lVar12 = local_60;
        lVar19 = local_68 + 1;
        buf = malloc((lVar19 - local_60) * *(long *)((long)&SPA->size + local_a8));
        local_90 = lVar12 + 1;
        local_98 = lVar19;
        pnga_get(local_80,&local_90,&local_98,buf,&local_70);
        if (local_a0 != 0) {
          switch(local_b0) {
          case 0:
            lVar19 = local_38;
            if (local_38 <= local_40) {
              do {
                lVar13 = (long)*(int *)(local_b8 + ((lVar19 + 1) - local_38) * 4) -
                         (long)*(int *)(local_b8 + (lVar19 - local_38) * 4);
                if (0 < (int)lVar13) {
                  lVar16 = 0;
                  do {
                    lVar15 = *(int *)(local_b8 + (lVar19 - local_38) * 4) + lVar16;
                    *(int *)(local_a0 + lVar15 * 4) =
                         *(int *)((long)buf + (*(int *)(local_c0 + lVar15 * 4) - lVar12) * 4) *
                         *(int *)(local_a0 + lVar15 * 4);
                    lVar16 = lVar16 + 1;
                  } while (lVar13 != lVar16);
                }
                bVar20 = lVar19 != local_40;
                lVar19 = lVar19 + 1;
              } while (bVar20);
            }
            break;
          case 1:
            lVar19 = local_38;
            if (local_38 <= local_40) {
              do {
                iVar6 = *(int *)(local_b8 + ((lVar19 + 1) - local_38) * 4);
                iVar7 = *(int *)(local_b8 + (lVar19 - local_38) * 4);
                lVar13 = (long)iVar7;
                if (iVar7 < iVar6) {
                  do {
                    *(long *)(local_a0 + lVar13 * 8) =
                         *(long *)((long)buf + (*(int *)(local_c0 + lVar13 * 4) - lVar12) * 8) *
                         *(long *)(local_a0 + lVar13 * 8);
                    lVar13 = lVar13 + 1;
                  } while (iVar6 != lVar13);
                }
                bVar20 = lVar19 != local_40;
                lVar19 = lVar19 + 1;
              } while (bVar20);
            }
            break;
          case 2:
            lVar19 = local_38;
            if (local_38 <= local_40) {
              do {
                iVar6 = *(int *)(local_b8 + ((lVar19 + 1) - local_38) * 4);
                iVar7 = *(int *)(local_b8 + (lVar19 - local_38) * 4);
                lVar13 = (long)iVar7;
                if (iVar7 < iVar6) {
                  do {
                    *(float *)(local_a0 + lVar13 * 4) =
                         *(float *)(local_a0 + lVar13 * 4) *
                         *(float *)((long)buf + (*(int *)(local_c0 + lVar13 * 4) - lVar12) * 4);
                    lVar13 = lVar13 + 1;
                  } while (iVar6 != lVar13);
                }
                bVar20 = lVar19 != local_40;
                lVar19 = lVar19 + 1;
              } while (bVar20);
            }
            break;
          case 3:
            lVar19 = local_38;
            if (local_38 <= local_40) {
              do {
                iVar6 = *(int *)(local_b8 + ((lVar19 + 1) - local_38) * 4);
                iVar7 = *(int *)(local_b8 + (lVar19 - local_38) * 4);
                lVar13 = (long)iVar7;
                if (iVar7 < iVar6) {
                  do {
                    *(double *)(local_a0 + lVar13 * 8) =
                         *(double *)(local_a0 + lVar13 * 8) *
                         *(double *)((long)buf + (*(int *)(local_c0 + lVar13 * 4) - lVar12) * 8);
                    lVar13 = lVar13 + 1;
                  } while (iVar6 != lVar13);
                }
                bVar20 = lVar19 != local_40;
                lVar19 = lVar19 + 1;
              } while (bVar20);
            }
            break;
          case 5:
            lVar19 = local_38;
            if (local_38 <= local_40) {
              do {
                iVar6 = *(int *)(local_b8 + ((lVar19 + 1) - local_38) * 4);
                iVar7 = *(int *)(local_b8 + (lVar19 - local_38) * 4);
                lVar13 = (long)iVar7;
                if (iVar7 < iVar6) {
                  do {
                    lVar16 = *(int *)(local_c0 + lVar13 * 4) - lVar12;
                    fVar1 = *(float *)((long)buf + lVar16 * 8);
                    fVar2 = *(float *)((long)buf + lVar16 * 8 + 4);
                    uVar5 = *(undefined8 *)(local_a0 + lVar13 * 8);
                    fVar21 = (float)uVar5;
                    fVar22 = (float)((ulong)uVar5 >> 0x20);
                    *(ulong *)(local_a0 + lVar13 * 8) =
                         CONCAT44(fVar1 * fVar22 + fVar21 * fVar2,fVar1 * fVar21 + fVar22 * -fVar2);
                    lVar13 = lVar13 + 1;
                  } while (iVar6 != lVar13);
                }
                bVar20 = lVar19 != local_40;
                lVar19 = lVar19 + 1;
              } while (bVar20);
            }
            break;
          case 6:
            lVar19 = local_38;
            if (local_38 <= local_40) {
              do {
                iVar6 = *(int *)(local_b8 + ((lVar19 + 1) - local_38) * 4);
                iVar7 = *(int *)(local_b8 + (lVar19 - local_38) * 4);
                lVar13 = (long)iVar7;
                if (iVar7 < iVar6) {
                  pauVar14 = (undefined1 (*) [16])(lVar13 * 0x10 + local_a0);
                  do {
                    lVar16 = (*(int *)(local_c0 + lVar13 * 4) - lVar12) * 0x10;
                    dVar3 = *(double *)((long)buf + lVar16);
                    dVar4 = *(double *)((long)buf + lVar16 + 8);
                    dVar11 = dVar3 * *(double *)(*pauVar14 + 8) + *(double *)*pauVar14 * dVar4;
                    auVar9._8_4_ = SUB84(dVar11,0);
                    auVar9._0_8_ = dVar3 * *(double *)*pauVar14 +
                                   *(double *)(*pauVar14 + 8) * -dVar4;
                    auVar9._12_4_ = (int)((ulong)dVar11 >> 0x20);
                    *pauVar14 = auVar9;
                    lVar13 = lVar13 + 1;
                    pauVar14 = pauVar14 + 1;
                  } while (iVar6 != lVar13);
                }
                bVar20 = lVar19 != local_40;
                lVar19 = lVar19 + 1;
              } while (bVar20);
            }
            break;
          case 0xf:
            lVar19 = local_38;
            if (local_38 <= local_40) {
              do {
                iVar6 = *(int *)(local_b8 + ((lVar19 + 1) - local_38) * 4);
                iVar7 = *(int *)(local_b8 + (lVar19 - local_38) * 4);
                lVar13 = (long)iVar7;
                if (iVar7 < iVar6) {
                  do {
                    *(long *)(local_a0 + lVar13 * 8) =
                         *(long *)((long)buf + (*(int *)(local_c0 + lVar13 * 4) - lVar12) * 8) *
                         *(long *)(local_a0 + lVar13 * 8);
                    lVar13 = lVar13 + 1;
                  } while (iVar6 != lVar13);
                }
                bVar20 = lVar19 != local_40;
                lVar19 = lVar19 + 1;
              } while (bVar20);
            }
          }
        }
      }
      else {
        pnga_sprs_array_access_col_block(IVar8,lVar18,&local_c8,&local_d0,&local_a0);
        lVar12 = local_60;
        lVar19 = local_68 + 1;
        buf = malloc((lVar19 - local_60) * *(long *)((long)&SPA->size + local_a8));
        local_90 = lVar12 + 1;
        local_98 = lVar19;
        pnga_get(local_80,&local_90,&local_98,buf,&local_70);
        if (local_a0 != 0) {
          switch(local_b0) {
          case 0:
            lVar19 = local_38;
            if (local_38 <= local_40) {
              do {
                lVar13 = *(long *)(local_c8 + ((lVar19 + 1) - local_38) * 8);
                lVar16 = *(long *)(local_c8 + (lVar19 - local_38) * 8);
                if (lVar16 < lVar13) {
                  do {
                    *(int *)(local_a0 + lVar16 * 4) =
                         *(int *)((long)buf + (*(long *)(local_d0 + lVar16 * 8) - lVar12) * 4) *
                         *(int *)(local_a0 + lVar16 * 4);
                    lVar16 = lVar16 + 1;
                  } while (lVar13 != lVar16);
                }
                bVar20 = lVar19 != local_40;
                lVar19 = lVar19 + 1;
              } while (bVar20);
            }
            break;
          case 1:
            lVar19 = local_38;
            if (local_38 <= local_40) {
              do {
                lVar13 = *(long *)(local_c8 + ((lVar19 + 1) - local_38) * 8);
                lVar16 = *(long *)(local_c8 + (lVar19 - local_38) * 8);
                if (lVar16 < lVar13) {
                  lVar15 = 0;
                  do {
                    lVar17 = *(long *)(local_c8 + (lVar19 - local_38) * 8) + lVar15;
                    *(long *)(local_a0 + lVar17 * 8) =
                         *(long *)((long)buf + (*(long *)(local_d0 + lVar17 * 8) - lVar12) * 8) *
                         *(long *)(local_a0 + lVar17 * 8);
                    lVar15 = lVar15 + 1;
                  } while (lVar13 - lVar16 != lVar15);
                }
                bVar20 = lVar19 != local_40;
                lVar19 = lVar19 + 1;
              } while (bVar20);
            }
            break;
          case 2:
            lVar19 = local_38;
            if (local_38 <= local_40) {
              do {
                lVar13 = *(long *)(local_c8 + ((lVar19 + 1) - local_38) * 8);
                lVar16 = *(long *)(local_c8 + (lVar19 - local_38) * 8);
                if (lVar16 < lVar13) {
                  do {
                    *(float *)(local_a0 + lVar16 * 4) =
                         *(float *)(local_a0 + lVar16 * 4) *
                         *(float *)((long)buf + (*(long *)(local_d0 + lVar16 * 8) - lVar12) * 4);
                    lVar16 = lVar16 + 1;
                  } while (lVar13 != lVar16);
                }
                bVar20 = lVar19 != local_40;
                lVar19 = lVar19 + 1;
              } while (bVar20);
            }
            break;
          case 3:
            lVar19 = local_38;
            if (local_38 <= local_40) {
              do {
                lVar13 = *(long *)(local_c8 + ((lVar19 + 1) - local_38) * 8);
                lVar16 = *(long *)(local_c8 + (lVar19 - local_38) * 8);
                if (lVar16 < lVar13) {
                  do {
                    *(double *)(local_a0 + lVar16 * 8) =
                         *(double *)(local_a0 + lVar16 * 8) *
                         *(double *)((long)buf + (*(long *)(local_d0 + lVar16 * 8) - lVar12) * 8);
                    lVar16 = lVar16 + 1;
                  } while (lVar13 != lVar16);
                }
                bVar20 = lVar19 != local_40;
                lVar19 = lVar19 + 1;
              } while (bVar20);
            }
            break;
          case 5:
            lVar19 = local_38;
            if (local_38 <= local_40) {
              do {
                lVar13 = *(long *)(local_c8 + ((lVar19 + 1) - local_38) * 8);
                lVar16 = *(long *)(local_c8 + (lVar19 - local_38) * 8);
                if (lVar16 < lVar13) {
                  do {
                    lVar15 = *(long *)(local_d0 + lVar16 * 8) - lVar12;
                    fVar1 = *(float *)((long)buf + lVar15 * 8);
                    fVar2 = *(float *)((long)buf + lVar15 * 8 + 4);
                    uVar5 = *(undefined8 *)(local_a0 + lVar16 * 8);
                    fVar21 = (float)uVar5;
                    fVar22 = (float)((ulong)uVar5 >> 0x20);
                    *(ulong *)(local_a0 + lVar16 * 8) =
                         CONCAT44(fVar1 * fVar22 + fVar21 * fVar2,fVar1 * fVar21 + fVar22 * -fVar2);
                    lVar16 = lVar16 + 1;
                  } while (lVar13 != lVar16);
                }
                bVar20 = lVar19 != local_40;
                lVar19 = lVar19 + 1;
              } while (bVar20);
            }
            break;
          case 6:
            lVar19 = local_38;
            if (local_38 <= local_40) {
              do {
                lVar13 = *(long *)(local_c8 + ((lVar19 + 1) - local_38) * 8);
                lVar16 = *(long *)(local_c8 + (lVar19 - local_38) * 8);
                if (lVar16 < lVar13) {
                  pauVar14 = (undefined1 (*) [16])(lVar16 * 0x10 + local_a0);
                  do {
                    lVar15 = (*(long *)(local_d0 + lVar16 * 8) - lVar12) * 0x10;
                    dVar3 = *(double *)((long)buf + lVar15);
                    dVar4 = *(double *)((long)buf + lVar15 + 8);
                    dVar11 = dVar3 * *(double *)(*pauVar14 + 8) + *(double *)*pauVar14 * dVar4;
                    auVar10._8_4_ = SUB84(dVar11,0);
                    auVar10._0_8_ =
                         dVar3 * *(double *)*pauVar14 + *(double *)(*pauVar14 + 8) * -dVar4;
                    auVar10._12_4_ = (int)((ulong)dVar11 >> 0x20);
                    *pauVar14 = auVar10;
                    lVar16 = lVar16 + 1;
                    pauVar14 = pauVar14 + 1;
                  } while (lVar13 != lVar16);
                }
                bVar20 = lVar19 != local_40;
                lVar19 = lVar19 + 1;
              } while (bVar20);
            }
            break;
          case 0xf:
            lVar19 = local_38;
            if (local_38 <= local_40) {
              do {
                lVar13 = *(long *)(local_c8 + ((lVar19 + 1) - local_38) * 8);
                lVar16 = *(long *)(local_c8 + (lVar19 - local_38) * 8);
                if (lVar16 < lVar13) {
                  do {
                    *(long *)(local_a0 + lVar16 * 8) =
                         *(long *)((long)buf + (*(long *)(local_d0 + lVar16 * 8) - lVar12) * 8) *
                         *(long *)(local_a0 + lVar16 * 8);
                    lVar16 = lVar16 + 1;
                  } while (lVar13 != lVar16);
                }
                bVar20 = lVar19 != local_40;
                lVar19 = lVar19 + 1;
              } while (bVar20);
            }
          }
        }
      }
      free(buf);
      lVar18 = lVar18 + 1;
    } while (lVar18 != local_78);
  }
  if (local_84 != 0) {
    pnga_pgroup_sync(local_58);
  }
  return;
}

Assistant:

void pnga_sprs_array_diag_right_multiply(Integer s_a, Integer g_d)
{
  Integer hdl = GA_OFFSET + s_a;
  Integer d_hdl = GA_OFFSET + g_d;
  int local_sync_begin,local_sync_end;
  Integer grp = SPA[hdl].grp;
  Integer me = pnga_pgroup_nodeid(grp);
  Integer nproc = pnga_pgroup_nnodes(grp);
  Integer ilo, ihi, jlo, jhi, klo, khi;
  Integer i, j, iproc, ncols;
  Integer type = SPA[hdl].type;
  int idx_size = SPA[hdl].idx_size;
  int *iptr = NULL, *jptr = NULL;
  int64_t *ilptr = NULL, *jlptr = NULL;
  Integer one = 1;
  void *vbuf;
  void *vptr;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if (local_sync_begin) pnga_pgroup_sync(grp);

  /* check for basic compatibility */
  if (SPA[hdl].idim != GA[d_hdl].dims[0]) {
    pnga_error("(pnga_sprs_array_diag_right_multiply) dimensions don't match",0);
  }
  if (type != GA[d_hdl].type) {
    pnga_error("(pnga_sprs_array_diag_right_multiply) data types don't match",0);
  }
  if (GA[d_hdl].ndim != 1) {
    pnga_error("(pnga_sprs_array_diag_right_multiply) vector not of dimension 1",0);
  }

#define SPRS_REAL_RIGHT_MULTIPLY_M(_type,_iptr,_jptr)                  \
  {                                                                    \
    _type *_buf = (_type*)vbuf;                                        \
    _type *_ptr = (_type*)vptr;                                        \
    for (i=ilo; i<=ihi; i++) {                                         \
      ncols = _iptr[i+1-ilo]-_iptr[i-ilo];                             \
      for (j=0; j<ncols; j++) {                                        \
        _ptr[_iptr[i-ilo]+j] = _ptr[_iptr[i-ilo]+j]                    \
        * _buf[_jptr[_iptr[i-ilo]+j]-jlo];                             \
      }                                                                \
    }                                                                  \
  }

#define SPRS_COMPLEX_RIGHT_MULTIPLY_M(_type,_iptr,_jptr)               \
  {                                                                    \
    _type *_buf = (_type*)vbuf;                                        \
    _type *_ptr = (_type*)vptr;                                        \
    _type rval, ival, rbuf, ibuf;                                      \
    for (i=ilo; i<=ihi; i++) {                                         \
      ncols = _iptr[i+1-ilo]-_iptr[i-ilo];                             \
      for (j=0; j<ncols; j++) {                                        \
        rbuf = _buf[2*(_jptr[_iptr[i-ilo]+j]-jlo)];                    \
        ibuf = _buf[2*(_jptr[_iptr[i-ilo]+j]-jlo)+1];                  \
        rval = _ptr[2*(_iptr[i-ilo]+j)];                               \
        ival = _ptr[2*(_iptr[i-ilo]+j)+1];                             \
        _ptr[2*(_iptr[i-ilo]+j)] = rbuf*rval-ibuf*ival;                \
        _ptr[2*(_iptr[i-ilo]+j)+1] = rbuf*ival+ibuf*rval;              \
      }                                                                \
    }                                                                  \
  }
  /* get block from diagonal array corresponding to this row block (there is
   * only one) */
  pnga_sprs_array_row_distribution(s_a,me,&ilo,&ihi);
  /* loop over blocks in sparse array */
  for (iproc=0; iproc<nproc; iproc++) {
    pnga_sprs_array_column_distribution(s_a,iproc,&jlo,&jhi);
    if (idx_size == 4) {
      pnga_sprs_array_access_col_block(s_a,iproc,&iptr,&jptr,&vptr);
      vbuf = malloc((jhi-jlo+1)*SPA[hdl].size);
      klo = jlo+1;
      khi = jhi+1;
      pnga_get(g_d,&klo,&khi,vbuf,&one);
      if (vptr != NULL) {
        if (type == C_INT) {
          SPRS_REAL_RIGHT_MULTIPLY_M(int,iptr,jptr);
        } else if (type == C_LONG) {
          SPRS_REAL_RIGHT_MULTIPLY_M(long,iptr,jptr);
        } else if (type == C_LONGLONG) {
          SPRS_REAL_RIGHT_MULTIPLY_M(long long,iptr,jptr);
        } else if (type == C_FLOAT) {
          SPRS_REAL_RIGHT_MULTIPLY_M(float,iptr,jptr);
        } else if (type == C_DBL) {
          SPRS_REAL_RIGHT_MULTIPLY_M(double,iptr,jptr);
        } else if (type == C_SCPL) {
          SPRS_COMPLEX_RIGHT_MULTIPLY_M(float,iptr,jptr);
        } else if (type == C_DCPL) {
          SPRS_COMPLEX_RIGHT_MULTIPLY_M(double,iptr,jptr);
        }
      }
    } else {
      pnga_sprs_array_access_col_block(s_a,iproc,&ilptr,&jlptr,&vptr);
      vbuf = malloc((jhi-jlo+1)*SPA[hdl].size);
      klo = jlo+1;
      khi = jhi+1;
      pnga_get(g_d,&klo,&khi,vbuf,&one);
      if (vptr != NULL) {
        if (type == C_INT) {
          SPRS_REAL_RIGHT_MULTIPLY_M(int,ilptr,jlptr);
        } else if (type == C_LONG) {
          SPRS_REAL_RIGHT_MULTIPLY_M(long,ilptr,jlptr);
        } else if (type == C_LONGLONG) {
          SPRS_REAL_RIGHT_MULTIPLY_M(long long,ilptr,jlptr);
        } else if (type == C_FLOAT) {
          SPRS_REAL_RIGHT_MULTIPLY_M(float,ilptr,jlptr);
        } else if (type == C_DBL) {
          SPRS_REAL_RIGHT_MULTIPLY_M(double,ilptr,jlptr);
        } else if (type == C_SCPL) {
          SPRS_COMPLEX_RIGHT_MULTIPLY_M(float,ilptr,jlptr);
        } else if (type == C_DCPL) {
          SPRS_COMPLEX_RIGHT_MULTIPLY_M(double,ilptr,jlptr);
        }
      }
    }
    free(vbuf);
  }

#undef SPRS_REAL_RIGHT_MULTIPLY_M
#undef SPRS_COMPLEX_RIGHT_MULTIPLY_M

  if (local_sync_end) pnga_pgroup_sync(grp);
}